

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

int quicly_ranges_subtract(quicly_ranges_t *ranges,uint64_t start,uint64_t end)

{
  int iVar1;
  size_t local_38;
  size_t slot;
  size_t shrink_from;
  uint64_t end_local;
  uint64_t start_local;
  quicly_ranges_t *ranges_local;
  
  if (end <= start) {
    __assert_fail("start < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/windrunner414[P]quicly/lib/ranges.c"
                  ,0x78,"int quicly_ranges_subtract(quicly_ranges_t *, uint64_t, uint64_t)");
  }
  if (((ranges->num_ranges != 0) && (ranges->ranges->start < end)) &&
     (start < ranges->ranges[ranges->num_ranges - 1].end)) {
    for (local_38 = 0; ranges->ranges[local_38].end < start; local_38 = local_38 + 1) {
    }
    if (ranges->ranges[local_38].end < end) {
      if (ranges->ranges[local_38].start < start) {
        ranges->ranges[local_38].end = start;
        slot = local_38 + 1;
      }
      else {
        slot = local_38;
      }
      do {
        local_38 = local_38 + 1;
        if ((local_38 == ranges->num_ranges) || (end <= ranges->ranges[local_38].start))
        goto LAB_0013374d;
      } while (ranges->ranges[local_38].end <= end);
      ranges->ranges[local_38].start = end;
LAB_0013374d:
      if (slot != local_38) {
        quicly_ranges_shrink(ranges,slot,local_38);
      }
    }
    else if (ranges->ranges[local_38].start < end) {
      if (ranges->ranges[local_38].start < start) {
        if (end != ranges->ranges[local_38].end) {
          iVar1 = insert_at(ranges,end,ranges->ranges[local_38].end,local_38 + 1);
          if (iVar1 == 0) {
            ranges->ranges[local_38].end = start;
            return 0;
          }
          return -1;
        }
        ranges->ranges[local_38].end = start;
      }
      else {
        ranges->ranges[local_38].start = end;
      }
      if (ranges->ranges[local_38].start == ranges->ranges[local_38].end) {
        quicly_ranges_shrink(ranges,local_38,local_38 + 1);
      }
    }
  }
  return 0;
}

Assistant:

int quicly_ranges_subtract(quicly_ranges_t *ranges, uint64_t start, uint64_t end)
{
    size_t shrink_from, slot;

    assert(start < end);

    if (ranges->num_ranges == 0) {
        return 0;
    } else if (end <= ranges->ranges[0].start) {
        return 0;
    } else if (ranges->ranges[ranges->num_ranges - 1].end <= start) {
        return 0;
    }

    /* find the first overlapping slot */
    for (slot = 0; ranges->ranges[slot].end < start; ++slot)
        ;

    if (end <= ranges->ranges[slot].end) {
        /* first overlapping slot is the only slot that we will ever modify */
        if (end <= ranges->ranges[slot].start)
            return 0;
        if (start <= ranges->ranges[slot].start) {
            ranges->ranges[slot].start = end;
        } else if (end == ranges->ranges[slot].end) {
            ranges->ranges[slot].end = start;
        } else {
            /* split */
            if (insert_at(ranges, end, ranges->ranges[slot].end, slot + 1) != 0)
                return -1;
            ranges->ranges[slot].end = start;
            return 0;
        }
        /* remove the slot if the range has become empty */
        if (ranges->ranges[slot].start == ranges->ranges[slot].end)
            quicly_ranges_shrink(ranges, slot, slot + 1);
        return 0;
    }

    /* specified region covers multiple slots */
    if (start <= ranges->ranges[slot].start) {
        shrink_from = slot;
    } else {
        ranges->ranges[slot].end = start;
        shrink_from = slot + 1;
    }

    /* find the last overlapping slot */
    for (++slot; slot != ranges->num_ranges; ++slot) {
        if (end <= ranges->ranges[slot].start)
            break;
        if (end < ranges->ranges[slot].end) {
            ranges->ranges[slot].start = end;
            break;
        }
    }

    /* remove shrink_from..slot */
    if (shrink_from != slot)
        quicly_ranges_shrink(ranges, shrink_from, slot);

    return 0;
}